

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# comm.c
# Opt level: O2

void read_from_buffer(DESCRIPTOR_DATA *d)

{
  char cVar1;
  int iVar2;
  char *pcVar3;
  char *pcVar4;
  int iVar5;
  char *__src;
  ulong uVar6;
  char *pcVar7;
  
  if (d->incomm[0] != '\0') {
    return;
  }
  pcVar4 = d->incomm;
  pcVar7 = d->inbuf;
  pcVar3 = pcVar7;
  while( true ) {
    cVar1 = *pcVar3;
    if (cVar1 == '\0') {
      return;
    }
    if ((cVar1 == '\r') || (cVar1 == '\n')) break;
    pcVar3 = pcVar3 + 1;
  }
  uVar6 = 0;
  iVar5 = 0;
  while( true ) {
    cVar1 = pcVar7[uVar6];
    if ((cVar1 == '\n') || (cVar1 == '\r')) goto LAB_002d2cdf;
    if (0x11fd < iVar5) break;
    if (iVar5 < 1 || cVar1 != '\b') {
      if ((-1 < cVar1) && (iVar2 = isprint((int)cVar1), iVar2 != 0)) {
        pcVar4[iVar5] = cVar1;
        iVar5 = iVar5 + 1;
      }
    }
    else {
      iVar5 = iVar5 + -1;
    }
    uVar6 = uVar6 + 1;
  }
  write_to_descriptor((int)d->descriptor,"Line too long.\n\r",0);
  while ((0xd < (byte)pcVar7[uVar6] || ((0x2401U >> ((byte)pcVar7[uVar6] & 0x1f) & 1) == 0))) {
    uVar6 = uVar6 + 1;
  }
  pcVar7[uVar6] = '\n';
  pcVar7[(int)uVar6 + 1] = '\0';
LAB_002d2cdf:
  if (iVar5 == 0) {
    d->incomm[0] = ' ';
    d->incomm[1] = '\0';
  }
  else {
    cVar1 = *pcVar4;
    pcVar4[iVar5] = '\0';
    if (cVar1 == '!') {
      __src = d->inlast;
      pcVar3 = pcVar4;
      goto LAB_002d2d0d;
    }
  }
  pcVar3 = d->inlast;
  __src = pcVar4;
LAB_002d2d0d:
  strcpy(pcVar3,__src);
  pcVar4 = d->inbuf + (uVar6 & 0xffffffff);
  while( true ) {
    if ((*pcVar4 != '\n') && (*pcVar4 != '\r')) break;
    uVar6 = (ulong)((int)uVar6 + 1);
    pcVar4 = pcVar4 + 1;
  }
  do {
    cVar1 = pcVar7[(int)uVar6];
    *pcVar7 = cVar1;
    pcVar7 = pcVar7 + 1;
  } while (cVar1 != '\0');
  return;
}

Assistant:

void read_from_buffer(DESCRIPTOR_DATA *d)
{
	int i, j, k;

	/*
	 * Hold horses if pending command already.
	 */
	if (d->incomm[0] != '\0')
		return;

	/*
	 * Look for at least one new line.
	 */
	for (i = 0; d->inbuf[i] != '\n' && d->inbuf[i] != '\r'; i++)
	{
		if (d->inbuf[i] == '\0')
			return;
	}

	/*
	 * Canonical input processing.
	 */
	for (i = 0, k = 0; d->inbuf[i] != '\n' && d->inbuf[i] != '\r'; i++)
	{
		if (k >= MAX_INPUT_LENGTH - 2)
		{
			write_to_descriptor(d->descriptor, "Line too long.\n\r", 0);

			/* skip the rest of the line */
			for (; d->inbuf[i] != '\0'; i++)
			{
				if (d->inbuf[i] == '\n' || d->inbuf[i] == '\r')
					break;
			}

			d->inbuf[i] = '\n';
			d->inbuf[i + 1] = '\0';
			break;
		}

		if (d->inbuf[i] == '\b' && k > 0)
			--k;
		else if (isascii(d->inbuf[i]) && isprint(d->inbuf[i]))
			d->incomm[k++] = d->inbuf[i];
	}

	/*
	 * Finish off the line.
	 */
	if (k == 0)
		d->incomm[k++] = ' ';

	d->incomm[k] = '\0';

	/*
	 * Do '!' substitution.
	 */
	if (d->incomm[0] == '!')
		strcpy(d->incomm, d->inlast);
	else
		strcpy(d->inlast, d->incomm);

	/*
	 * Shift the input buffer.
	 */
	while (d->inbuf[i] == '\n' || d->inbuf[i] == '\r')
		i++;
	for (j = 0; (d->inbuf[j] = d->inbuf[i + j]) != '\0'; j++)
		;
	return;
}